

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O2

EventRegistry * __thiscall
license::LicenseReader::getLicenseDiskFiles
          (EventRegistry *__return_storage_ptr__,LicenseReader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *diskFiles)

{
  bool bVar1;
  bool bVar2;
  FUNCTION_RETURN FVar3;
  int *piVar4;
  EVENT_TYPE event;
  bool bVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  allocator local_1251;
  string temptativeLicense;
  ifstream f;
  int aiStack_1210 [122];
  char fname [4096];
  
  EventRegistry::EventRegistry(__return_storage_ptr__);
  bVar1 = findLicenseWithExplicitLocation(this,diskFiles,__return_storage_ptr__);
  if ((this->licenseLocation).openFileNearModule == true) {
    memset(fname,0,0x1000);
    FVar3 = getModuleName(fname);
    if (FVar3 == FUNC_RET_OK) {
      std::__cxx11::string::string((string *)&f,fname,&local_1251);
      std::operator+(&temptativeLicense,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,".lic")
      ;
      std::__cxx11::string::~string((string *)&f);
      std::ifstream::ifstream(&f,temptativeLicense._M_dataplus._M_p,_S_in);
      bVar5 = *(int *)((long)aiStack_1210 + *(long *)(_f + -0x18)) == 0;
      if (bVar5) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(diskFiles,&temptativeLicense);
        event = LICENSE_FILE_FOUND;
      }
      else {
        event = LICENSE_FILE_NOT_FOUND;
      }
      EventRegistry::addEvent(__return_storage_ptr__,event,(uint)!bVar5,&temptativeLicense);
      std::ifstream::close();
      std::ifstream::~ifstream(&f);
      std::__cxx11::string::~string((string *)&temptativeLicense);
    }
    else {
      piVar4 = __errno_location();
      __x = extraout_XMM0_Qa;
      if (*piVar4 != 0) {
        strerror(*piVar4);
        __x = extraout_XMM0_Qa_00;
      }
      bVar5 = false;
      _log(__x);
    }
  }
  else {
    bVar5 = false;
  }
  bVar2 = findFileWithEnvironmentVariable(this,diskFiles,__return_storage_ptr__);
  if ((!bVar1 && !bVar5) && !bVar2) {
    EventRegistry::turnEventIntoError(__return_storage_ptr__,ENVIRONMENT_VARIABLE_NOT_DEFINED);
    EventRegistry::turnEventIntoError(__return_storage_ptr__,LICENSE_FILE_NOT_FOUND);
  }
  return __return_storage_ptr__;
}

Assistant:

EventRegistry LicenseReader::getLicenseDiskFiles(vector<string>& diskFiles) {
	EventRegistry eventRegistry;
	bool licenseFoundWithExplicitLocation = findLicenseWithExplicitLocation(
			diskFiles, eventRegistry);
	bool foundNearModule = false;
	if (licenseLocation.openFileNearModule) {
		char fname[MAX_PATH] = { 0 };
		FUNCTION_RETURN fret = getModuleName(fname);
		if (fret == FUNC_RET_OK) {
			string temptativeLicense = string(fname) + ".lic";
			ifstream f(temptativeLicense.c_str());
			if (f.good()) {
				foundNearModule = true;
				diskFiles.push_back(temptativeLicense);
				eventRegistry.addEvent(LICENSE_FILE_FOUND, SVRT_INFO,
						temptativeLicense);
			} else {
				eventRegistry.addEvent(LICENSE_FILE_NOT_FOUND, SVRT_WARN,
						temptativeLicense);
			}
			f.close();
		} else {
			LOG_WARN("Error determining module name.");
		}
	}
	bool licenseFileFoundWithEnvVariable = findFileWithEnvironmentVariable(
			diskFiles, eventRegistry);

	if (!foundNearModule && !licenseFoundWithExplicitLocation
			&& !licenseFileFoundWithEnvVariable) {
		eventRegistry.turnEventIntoError(ENVIRONMENT_VARIABLE_NOT_DEFINED);
		eventRegistry.turnEventIntoError(LICENSE_FILE_NOT_FOUND);
	}
	return eventRegistry;
}